

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void tlstran_pipe_recv(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  nni_aio *pnVar2;
  tlstran_pipe *p;
  nni_aio *aio_local;
  void *arg_local;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x600));
  _Var1 = nni_aio_start(aio,tlstran_pipe_recv_cancel,arg);
  if (_Var1) {
    nni_aio_list_append((nni_list *)((long)arg + 0x50),aio);
    pnVar2 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x50));
    if (pnVar2 == aio) {
      tlstran_pipe_recv_start((tlstran_pipe *)arg);
    }
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
  }
  else {
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
  }
  return;
}

Assistant:

static void
tlstran_pipe_recv(void *arg, nni_aio *aio)
{
	tlstran_pipe *p = arg;

	nni_aio_reset(aio);
	nni_mtx_lock(&p->mtx);
	if (!nni_aio_start(aio, tlstran_pipe_recv_cancel, p)) {
		nni_mtx_unlock(&p->mtx);
		return;
	}

	nni_aio_list_append(&p->recvq, aio);
	if (nni_list_first(&p->recvq) == aio) {
		tlstran_pipe_recv_start(p);
	}
	nni_mtx_unlock(&p->mtx);
}